

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O1

int h264_seqparm_mvc(bitstream *str,h264_seqparm *seqparm)

{
  int iVar1;
  h264_seqparm_mvc_view *phVar2;
  h264_seqparm_mvc_level *phVar3;
  h264_seqparm_mvc_applicable_op *phVar4;
  uint32_t *puVar5;
  h264_vui *phVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  uint32_t bit_equal_to_one;
  uint32_t mvc_vui_parameters_present_flag;
  long local_58;
  uint32_t local_40;
  uint local_3c;
  ulong local_38;
  
  local_40 = 1;
  if (str->dir == VS_DECODE) {
    seqparm->is_mvc = 1;
  }
  iVar9 = 1;
  iVar1 = vs_u(str,&local_40,1);
  if (iVar1 == 0) {
    if (local_40 == 0) {
      h264_seqparm_mvc_cold_5();
    }
    else {
      puVar5 = &seqparm->num_views_minus1;
      iVar1 = vs_ue(str,puVar5);
      if (iVar1 == 0) {
        if (str->dir == VS_DECODE) {
          phVar2 = (h264_seqparm_mvc_view *)calloc(0x104,(ulong)(seqparm->num_views_minus1 + 1));
          seqparm->views = phVar2;
        }
        uVar11 = 0xffffffffffffffff;
        lVar7 = 0;
        do {
          iVar1 = vs_ue(str,(uint32_t *)((long)seqparm->views->anchor_ref_l0 + lVar7 + -8));
          if (iVar1 != 0) {
            return 1;
          }
          uVar11 = uVar11 + 1;
          lVar7 = lVar7 + 0x104;
        } while (uVar11 < *puVar5);
        if (*puVar5 != 0) {
          lVar7 = 0x10c;
          local_58 = 0x14c;
          uVar11 = 1;
          do {
            iVar1 = vs_ue(str,&seqparm->views[uVar11].num_anchor_refs_l0);
            if (iVar1 != 0) {
              return 1;
            }
            if (0xf < seqparm->views[uVar11].num_anchor_refs_l0) {
              h264_seqparm_mvc_cold_2();
              return 1;
            }
            phVar2 = seqparm->views;
            if (phVar2[uVar11].num_anchor_refs_l0 != 0) {
              uVar8 = 0;
              lVar10 = lVar7;
              do {
                iVar1 = vs_ue(str,(uint32_t *)((long)phVar2->anchor_ref_l0 + lVar10 + -8));
                if (iVar1 != 0) {
                  return 1;
                }
                uVar8 = uVar8 + 1;
                phVar2 = seqparm->views;
                lVar10 = lVar10 + 4;
              } while (uVar8 < phVar2[uVar11].num_anchor_refs_l0);
            }
            iVar1 = vs_ue(str,&phVar2[uVar11].num_anchor_refs_l1);
            if (iVar1 != 0) {
              return 1;
            }
            if (0xf < seqparm->views[uVar11].num_anchor_refs_l1) {
              h264_seqparm_mvc_cold_1();
              return 1;
            }
            phVar2 = seqparm->views;
            if (phVar2[uVar11].num_anchor_refs_l1 != 0) {
              uVar8 = 0;
              lVar10 = local_58;
              do {
                iVar1 = vs_ue(str,(uint32_t *)((long)phVar2->anchor_ref_l0 + lVar10 + -8));
                if (iVar1 != 0) {
                  return 1;
                }
                uVar8 = uVar8 + 1;
                phVar2 = seqparm->views;
                lVar10 = lVar10 + 4;
              } while (uVar8 < phVar2[uVar11].num_anchor_refs_l1);
            }
            lVar7 = lVar7 + 0x104;
            local_58 = local_58 + 0x104;
            bVar13 = uVar11 < *puVar5;
            uVar11 = uVar11 + 1;
          } while (bVar13);
        }
        if (*puVar5 != 0) {
          lVar7 = 0x18c;
          local_58 = 0x1cc;
          uVar11 = 1;
          do {
            iVar1 = vs_ue(str,&seqparm->views[uVar11].num_non_anchor_refs_l0);
            if (iVar1 != 0) {
              return 1;
            }
            if (0xf < seqparm->views[uVar11].num_non_anchor_refs_l0) {
              h264_seqparm_mvc_cold_4();
              return 1;
            }
            phVar2 = seqparm->views;
            if (phVar2[uVar11].num_non_anchor_refs_l0 != 0) {
              uVar8 = 0;
              lVar10 = lVar7;
              do {
                iVar1 = vs_ue(str,(uint32_t *)((long)phVar2->anchor_ref_l0 + lVar10 + -8));
                if (iVar1 != 0) {
                  return 1;
                }
                uVar8 = uVar8 + 1;
                phVar2 = seqparm->views;
                lVar10 = lVar10 + 4;
              } while (uVar8 < phVar2[uVar11].num_non_anchor_refs_l0);
            }
            iVar1 = vs_ue(str,&phVar2[uVar11].num_non_anchor_refs_l1);
            if (iVar1 != 0) {
              return 1;
            }
            if (0xf < seqparm->views[uVar11].num_non_anchor_refs_l1) {
              h264_seqparm_mvc_cold_3();
              return 1;
            }
            phVar2 = seqparm->views;
            if (phVar2[uVar11].num_non_anchor_refs_l1 != 0) {
              uVar8 = 0;
              lVar10 = local_58;
              do {
                iVar1 = vs_ue(str,(uint32_t *)((long)phVar2->anchor_ref_l0 + lVar10 + -8));
                if (iVar1 != 0) {
                  return 1;
                }
                uVar8 = uVar8 + 1;
                phVar2 = seqparm->views;
                lVar10 = lVar10 + 4;
              } while (uVar8 < phVar2[uVar11].num_non_anchor_refs_l1);
            }
            lVar7 = lVar7 + 0x104;
            local_58 = local_58 + 0x104;
            bVar13 = uVar11 < *puVar5;
            uVar11 = uVar11 + 1;
          } while (bVar13);
        }
        iVar1 = vs_ue(str,&seqparm->num_level_values_signalled_minus1);
        iVar9 = 1;
        if (iVar1 == 0) {
          if (str->dir == VS_DECODE) {
            phVar3 = (h264_seqparm_mvc_level *)
                     calloc(0x10,(ulong)(seqparm->num_level_values_signalled_minus1 + 1));
            seqparm->levels = phVar3;
          }
          uVar11 = 0;
          do {
            iVar1 = vs_u(str,&seqparm->levels[uVar11].level_idc,8);
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = vs_ue(str,&seqparm->levels[uVar11].num_applicable_ops_minus1);
            if (iVar1 != 0) {
              return 1;
            }
            local_38 = uVar11;
            if (str->dir == VS_DECODE) {
              phVar3 = seqparm->levels;
              phVar4 = (h264_seqparm_mvc_applicable_op *)
                       calloc(0x18,(ulong)(phVar3[uVar11].num_applicable_ops_minus1 + 1));
              phVar3[uVar11].applicable_ops = phVar4;
            }
            phVar3 = seqparm->levels;
            uVar8 = 0;
            do {
              iVar1 = vs_u(str,&phVar3[uVar11].applicable_ops[uVar8].temporal_id,3);
              if (iVar1 != 0) {
                return 1;
              }
              iVar1 = vs_ue(str,&seqparm->levels[uVar11].applicable_ops[uVar8].
                                 num_target_views_minus1);
              if (iVar1 != 0) {
                return 1;
              }
              if (str->dir == VS_DECODE) {
                phVar4 = seqparm->levels[uVar11].applicable_ops;
                puVar5 = (uint32_t *)calloc(4,(ulong)(phVar4[uVar8].num_target_views_minus1 + 1));
                phVar4[uVar8].target_view_id = puVar5;
              }
              phVar4 = seqparm->levels[uVar11].applicable_ops;
              uVar12 = 0xffffffffffffffff;
              lVar7 = 0;
              do {
                iVar1 = vs_ue(str,(uint32_t *)((long)phVar4[uVar8].target_view_id + lVar7));
                if (iVar1 != 0) {
                  return 1;
                }
                phVar4 = seqparm->levels[uVar11].applicable_ops;
                uVar12 = uVar12 + 1;
                lVar7 = lVar7 + 4;
              } while (uVar12 < phVar4[uVar8].num_target_views_minus1);
              iVar1 = vs_ue(str,&phVar4[uVar8].num_views_minus1);
              if (iVar1 != 0) {
                return 1;
              }
              phVar3 = seqparm->levels;
              bVar13 = uVar8 < phVar3[uVar11].num_applicable_ops_minus1;
              iVar9 = 1;
              uVar8 = uVar8 + 1;
            } while (bVar13);
            uVar11 = local_38 + 1;
          } while (local_38 < seqparm->num_level_values_signalled_minus1);
          local_3c = (uint)(seqparm->mvc_vui != (h264_vui *)0x0);
          iVar1 = vs_u(str,&local_3c,1);
          if (iVar1 == 0) {
            if (local_3c != 0) {
              if (str->dir == VS_DECODE) {
                phVar6 = (h264_vui *)calloc(0x88,1);
                seqparm->mvc_vui = phVar6;
              }
              abort();
            }
            seqparm->mvc_vui = (h264_vui *)0x0;
            iVar9 = 0;
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int h264_seqparm_mvc(struct bitstream *str, struct h264_seqparm *seqparm) {
	uint32_t bit_equal_to_one = 1;
	int i, j, k;
	if (str->dir == VS_DECODE)
		seqparm->is_mvc = 1;
	if (vs_u(str, &bit_equal_to_one, 1)) return 1;
	if (!bit_equal_to_one) {
		fprintf(stderr, "bit_equal_to_one invalid\n");
		return 1;
	}
	if (vs_ue(str, &seqparm->num_views_minus1)) return 1;
	if (str->dir == VS_DECODE)
		seqparm->views = calloc(sizeof *seqparm->views, seqparm->num_views_minus1 + 1);
	for (i = 0; i <= seqparm->num_views_minus1; i++)
		if (vs_ue(str, &seqparm->views[i].view_id)) return 1;
	for (i = 1; i <= seqparm->num_views_minus1; i++) {
		if (vs_ue(str, &seqparm->views[i].num_anchor_refs_l0)) return 1;
		if (seqparm->views[i].num_anchor_refs_l0 > 15) {
			fprintf (stderr, "num_anchor_refs_l0 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_anchor_refs_l0; j++)
			if (vs_ue(str, &seqparm->views[i].anchor_ref_l0[j])) return 1;
		if (vs_ue(str, &seqparm->views[i].num_anchor_refs_l1)) return 1;
		if (seqparm->views[i].num_anchor_refs_l1 > 15) {
			fprintf (stderr, "num_anchor_refs_l1 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_anchor_refs_l1; j++)
			if (vs_ue(str, &seqparm->views[i].anchor_ref_l1[j])) return 1;
	}
	for (i = 1; i <= seqparm->num_views_minus1; i++) {
		if (vs_ue(str, &seqparm->views[i].num_non_anchor_refs_l0)) return 1;
		if (seqparm->views[i].num_non_anchor_refs_l0 > 15) {
			fprintf (stderr, "num_non_anchor_refs_l0 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_non_anchor_refs_l0; j++)
			if (vs_ue(str, &seqparm->views[i].non_anchor_ref_l0[j])) return 1;
		if (vs_ue(str, &seqparm->views[i].num_non_anchor_refs_l1)) return 1;
		if (seqparm->views[i].num_non_anchor_refs_l1 > 15) {
			fprintf (stderr, "num_non_anchor_refs_l1 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_non_anchor_refs_l1; j++)
			if (vs_ue(str, &seqparm->views[i].non_anchor_ref_l1[j])) return 1;
	}
	if (vs_ue(str, &seqparm->num_level_values_signalled_minus1)) return 1;
	if (str->dir == VS_DECODE)
		seqparm->levels = calloc(sizeof *seqparm->levels, seqparm->num_level_values_signalled_minus1 + 1);
	for (i = 0; i <= seqparm->num_level_values_signalled_minus1; i++) {
		if (vs_u(str, &seqparm->levels[i].level_idc, 8)) return 1;
		if (vs_ue(str, &seqparm->levels[i].num_applicable_ops_minus1)) return 1;
		if (str->dir == VS_DECODE)
			seqparm->levels[i].applicable_ops = calloc(sizeof *seqparm->levels[i].applicable_ops, seqparm->levels[i].num_applicable_ops_minus1 + 1);
		for (j = 0; j <= seqparm->levels[i].num_applicable_ops_minus1; j++) {
			if (vs_u(str, &seqparm->levels[i].applicable_ops[j].temporal_id, 3)) return 1;
			if (vs_ue(str, &seqparm->levels[i].applicable_ops[j].num_target_views_minus1)) return 1;
			if (str->dir == VS_DECODE)
				seqparm->levels[i].applicable_ops[j].target_view_id = calloc(sizeof *seqparm->levels[i].applicable_ops[j].target_view_id, seqparm->levels[i].applicable_ops[j].num_target_views_minus1 + 1);
			for (k = 0; k <= seqparm->levels[i].applicable_ops[j].num_target_views_minus1; k++)
				if (vs_ue(str, &seqparm->levels[i].applicable_ops[j].target_view_id[k])) return 1;
			if (vs_ue(str, &seqparm->levels[i].applicable_ops[j].num_views_minus1)) return 1;
		}
	}
	uint32_t mvc_vui_parameters_present_flag = !!(seqparm->mvc_vui);
	if (vs_u(str, &mvc_vui_parameters_present_flag, 1)) return 1;
	if (mvc_vui_parameters_present_flag) {
		if (str->dir == VS_DECODE) {
			seqparm->mvc_vui = calloc (sizeof *seqparm->mvc_vui, 1);
		}
		if (h264_mvc_vui_parameters(str, seqparm->mvc_vui)) return 1;
	} else {
		seqparm->mvc_vui = 0;
	}
	return 0;
}